

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontendTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_103e4::BuildSystemFrontendTest::SetUp(BuildSystemFrontendTest *this)

{
  string sStack_58;
  string local_38;
  
  llbuild::TmpDir::str_abi_cxx11_(&sStack_58,&this->tempDir);
  std::__cxx11::string::operator=((string *)&(this->invocation).chdirPath,(string *)&sStack_58);
  std::__cxx11::string::_M_dispose();
  llbuild::TmpDir::str_abi_cxx11_(&local_38,&this->tempDir);
  std::operator+(&sStack_58,&local_38,"/trace.log");
  std::__cxx11::string::operator=((string *)&(this->invocation).traceFilePath,(string *)&sStack_58);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void SetUp() override {
    invocation.chdirPath = tempDir.str();
    invocation.traceFilePath = tempDir.str() + "/trace.log";
  }